

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore_test.cpp
# Opt level: O2

void __thiscall
SemaphoreTest_CtorZero_Test<GenericSemaphore>::TestBody
          (SemaphoreTest_CtorZero_Test<GenericSemaphore> *this)

{
  bool bVar1;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  counting_semaphore<1L> local_70;
  
  local_b0 = &local_a0;
  local_a0 = 0;
  uStack_98 = 0;
  local_a8 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::counting_semaphore<1L>::counting_semaphore(&local_70,0);
    std::condition_variable::~condition_variable(&local_70.cv_);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

TYPED_TEST(SemaphoreTest, CtorZero)
{
  using counting_semaphore = typename TypeParam::template counting_semaphore<1>;
  EXPECT_NO_THROW(counting_semaphore{0});
}